

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_shared_mutex.hpp
# Opt level: O2

bool __thiscall
yamc::alternate::detail::shared_mutex_base<yamc::rwlock::WriterPrefer>::try_lock_shared
          (shared_mutex_base<yamc::rwlock::WriterPrefer> *this)

{
  size_t sVar1;
  
  std::mutex::lock(&this->mtx_);
  sVar1 = (this->state_).nwriter;
  if (sVar1 == 0) {
    rwlock::WriterPrefer::acquire_rlock(&this->state_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
  return sVar1 == 0;
}

Assistant:

bool try_lock_shared()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (RwLockPolicy::wait_rlock(state_))
      return false;
    RwLockPolicy::acquire_rlock(state_);
    return true;
  }